

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

Status __thiscall
leveldb::Table::InternalGet
          (Table *this,ReadOptions *options,Slice *k,void *arg,
          _func_void_void_ptr_Slice_ptr_Slice_ptr *handle_result)

{
  FilterBlockReader *this_00;
  bool bVar1;
  int iVar2;
  Iterator *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Iterator *pIVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  code *in_R9;
  Slice handle_value;
  BlockHandle handle;
  undefined1 local_98 [24];
  Table local_80 [2];
  _func_void_void_ptr_Slice_ptr_Slice_ptr *local_70;
  code *local_68;
  ReadOptions *local_60;
  Slice local_58;
  undefined8 local_40 [2];
  
  this->rep_ = (Rep *)0x0;
  local_60 = (ReadOptions *)k;
  pIVar3 = Block::NewIterator((Block *)(*(undefined8 **)options)[0x13],
                              (Comparator *)**(undefined8 **)options);
  (*pIVar3->_vptr_Iterator[5])(pIVar3,arg);
  iVar2 = (*pIVar3->_vptr_Iterator[2])(pIVar3);
  if ((char)iVar2 == '\0') goto LAB_0011ce0a;
  local_70 = handle_result;
  iVar2 = (*pIVar3->_vptr_Iterator[9])(pIVar3);
  local_80[0].rep_ = (Rep *)CONCAT44(extraout_var,iVar2);
  this_00 = *(FilterBlockReader **)(*(long *)options + 0x78);
  local_58.data_._0_4_ = 0xffffffff;
  local_58.data_._4_4_ = 0xffffffff;
  local_58.size_._0_4_ = 0xffffffff;
  local_58.size_._4_4_ = 0xffffffff;
  local_68 = in_R9;
  if (this_00 == (FilterBlockReader *)0x0) {
LAB_0011cd37:
    bVar1 = false;
  }
  else {
    BlockHandle::DecodeFrom((BlockHandle *)local_98,&local_58);
    if ((void *)local_98._0_8_ != (void *)0x0) goto LAB_0011cd37;
    bVar1 = FilterBlockReader::KeyMayMatch
                      (this_00,CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_),(Slice *)arg);
    bVar1 = !bVar1;
  }
  if ((this_00 != (FilterBlockReader *)0x0) && ((void *)local_98._0_8_ != (void *)0x0)) {
    operator_delete__((void *)local_98._0_8_);
  }
  if (!bVar1) {
    iVar2 = (*pIVar3->_vptr_Iterator[9])(pIVar3);
    local_98._8_8_ = CONCAT44(extraout_var_00,iVar2);
    pIVar4 = BlockReader(options,local_60,(Slice *)(local_98 + 8));
    (*pIVar4->_vptr_Iterator[5])(pIVar4,arg);
    iVar2 = (*pIVar4->_vptr_Iterator[2])(pIVar4);
    if ((char)iVar2 != '\0') {
      iVar2 = (*pIVar4->_vptr_Iterator[8])(pIVar4);
      local_98._8_8_ = CONCAT44(extraout_var_01,iVar2);
      iVar2 = (*pIVar4->_vptr_Iterator[9])(pIVar4);
      local_40[0] = CONCAT44(extraout_var_02,iVar2);
      (*local_68)(local_70,local_98 + 8,local_40);
    }
    (*pIVar4->_vptr_Iterator[10])(local_98 + 8,pIVar4);
    this->rep_ = (Rep *)local_98._8_8_;
    (*pIVar4->_vptr_Iterator[1])(pIVar4);
  }
LAB_0011ce0a:
  if (this->rep_ == (Rep *)0x0) {
    (*pIVar3->_vptr_Iterator[10])(local_80,pIVar3);
    this->rep_ = (Rep *)local_80[0];
  }
  (*pIVar3->_vptr_Iterator[1])(pIVar3);
  return (Status)(char *)this;
}

Assistant:

Status Table::InternalGet(const ReadOptions& options, const Slice& k, void* arg,
                          void (*handle_result)(void*, const Slice&,
                                                const Slice&)) {
  Status s;
  Iterator* iiter = rep_->index_block->NewIterator(rep_->options.comparator);
  iiter->Seek(k);
  if (iiter->Valid()) {
    Slice handle_value = iiter->value();
    FilterBlockReader* filter = rep_->filter;
    BlockHandle handle;
    if (filter != nullptr && handle.DecodeFrom(&handle_value).ok() &&
        !filter->KeyMayMatch(handle.offset(), k)) {
      // Not found
    } else {
      Iterator* block_iter = BlockReader(this, options, iiter->value());
      block_iter->Seek(k);
      if (block_iter->Valid()) {
        (*handle_result)(arg, block_iter->key(), block_iter->value());
      }
      s = block_iter->status();
      delete block_iter;
    }
  }
  if (s.ok()) {
    s = iiter->status();
  }
  delete iiter;
  return s;
}